

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

void __thiscall QAccessibleToolButton::doAction(QAccessibleToolButton *this)

{
  QString *in_RSI;
  
  doAction((QAccessibleToolButton *)
           &this[-1].super_QAccessibleButton.super_QAccessibleWidget.
            super_QAccessibleActionInterface,in_RSI);
  return;
}

Assistant:

void QAccessibleToolButton::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == pressAction()) {
        button()->click();
    } else if (actionName == showMenuAction()) {
#if QT_CONFIG(menu)
        if (toolButton()->popupMode() != QToolButton::InstantPopup) {
            toolButton()->setDown(true);
            toolButton()->showMenu();
        }
#endif
    } else {
        QAccessibleButton::doAction(actionName);
    }

}